

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

ProString * __thiscall
ProString::mid(ProString *__return_storage_ptr__,ProString *this,int off,int len)

{
  uint uVar1;
  
  *(undefined8 *)&__return_storage_ptr__->m_file = 0xaaaaaaaaaaaaaaaa;
  __return_storage_ptr__->m_hash = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.size = -0x5555555555555556;
  __return_storage_ptr__->m_offset = -0x55555556;
  __return_storage_ptr__->m_length = -0x55555556;
  (__return_storage_ptr__->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString(__return_storage_ptr__,this,NoHash);
  if (this->m_length < off) {
    off = this->m_length;
  }
  __return_storage_ptr__->m_offset = __return_storage_ptr__->m_offset + off;
  uVar1 = __return_storage_ptr__->m_length - off;
  if ((uint)len <= uVar1) {
    uVar1 = len;
  }
  __return_storage_ptr__->m_length = uVar1;
  return __return_storage_ptr__;
}

Assistant:

ProString ProString::mid(int off, int len) const
{
    ProString ret(*this, NoHash);
    if (off > m_length)
        off = m_length;
    ret.m_offset += off;
    ret.m_length -= off;
    if ((uint)ret.m_length > (uint)len)  // Unsigned comparison to interpret < 0 as infinite
        ret.m_length = len;
    return ret;
}